

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::DrawIndirect(DeviceContextGLImpl *this,DrawIndirectAttribs *Attribs)

{
  uint uVar1;
  Uint32 draw;
  ulong uVar2;
  GLenum err;
  GLenum GlTopology;
  string msg;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::DrawIndirect
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  PrepareForDraw(this,Attribs->Flags,true,&GlTopology);
  PrepareForIndirectDraw(this,Attribs->pAttribsBuffer);
  if (Attribs->pCounterBuffer == (IBuffer *)0x0) {
    uVar1 = Attribs->DrawCount;
    if ((uVar1 < 2) ||
       (((((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pDevice.m_pObject)->
         super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_AdapterInfo.DrawCommand.CapFlags &
        DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT) == DRAW_COMMAND_CAP_FLAG_NONE)) {
      for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
        (*__glewDrawArraysIndirect)
                  (GlTopology,(void *)(Attribs->DrawArgsStride * uVar2 + Attribs->DrawArgsOffset));
        err = glGetError();
        if (err != 0) {
          LogError<false,char[30],char[17],unsigned_int>
                    (false,"DrawIndirect",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x4c4,(char (*) [30])"glDrawArraysIndirect() failed",
                     (char (*) [17])"\nGL Error Code: ",&err);
          FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"DrawIndirect",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x4c4);
          std::__cxx11::string::~string((string *)&msg);
        }
        uVar1 = Attribs->DrawCount;
      }
    }
    else {
      (*__glewMultiDrawArraysIndirect)
                (GlTopology,(void *)Attribs->DrawArgsOffset,uVar1,Attribs->DrawArgsStride);
      err = glGetError();
      if (err != 0) {
        LogError<false,char[35],char[17],unsigned_int>
                  (false,"DrawIndirect",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x4b0,(char (*) [35])"glMultiDrawArraysIndirect() failed",
                   (char (*) [17])"\nGL Error Code: ",&err);
        FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DrawIndirect",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x4b0);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
  }
  else {
    PrepareForIndirectDrawCount(this,Attribs->pCounterBuffer);
    (*__glewMultiDrawArraysIndirectCount)
              (GlTopology,(GLvoid *)Attribs->DrawArgsOffset,Attribs->CounterOffset,
               Attribs->DrawCount,Attribs->DrawArgsStride);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[40],char[17],unsigned_int>
                (false,"DrawIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x4d5,(char (*) [40])"glMultiDrawArraysIndirectCount() failed",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DrawIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x4d5);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = (pointer)0x0;
    msg._M_string_length._0_4_ = 0;
    GLContextState::BindBuffer(&this->m_ContextState,0x80ee,(GLBufferObj *)&msg,false);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
              ((GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *)&msg);
  }
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length._0_4_ = 0;
  GLContextState::BindBuffer(&this->m_ContextState,0x8f3f,(GLBufferObj *)&msg,false);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
            ((GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *)&msg);
  PostDraw(this);
  return;
}

Assistant:

void DeviceContextGLImpl::DrawIndirect(const DrawIndirectAttribs& Attribs)
{
    TDeviceContextBase::DrawIndirect(Attribs, 0);

    GLenum GlTopology;
    PrepareForDraw(Attribs.Flags, true, GlTopology);

    // http://www.opengl.org/wiki/Vertex_Rendering
    PrepareForIndirectDraw(Attribs.pAttribsBuffer);

    if (Attribs.pCounterBuffer == nullptr)
    {
        bool NativeMultiDrawExecuted = false;
        if (Attribs.DrawCount > 1)
        {
#if GL_ARB_multi_draw_indirect
            if ((m_pDevice->GetAdapterInfo().DrawCommand.CapFlags & DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT) != 0)
            {
                glMultiDrawArraysIndirect(GlTopology,
                                          reinterpret_cast<const void*>(StaticCast<size_t>(Attribs.DrawArgsOffset)),
                                          Attribs.DrawCount,
                                          Attribs.DrawArgsStride);
                DEV_CHECK_GL_ERROR("glMultiDrawArraysIndirect() failed");
                NativeMultiDrawExecuted = true;
            }
#endif
        }

        if (!NativeMultiDrawExecuted)
        {
#if GL_ARB_draw_indirect
            for (Uint32 draw = 0; draw < Attribs.DrawCount; ++draw)
            {
                Uint64 Offset = Attribs.DrawArgsOffset + draw * Uint64{Attribs.DrawArgsStride};
                //typedef  struct {
                //   GLuint  count;
                //   GLuint  instanceCount;
                //   GLuint  first;
                //   GLuint  baseInstance;
                //} DrawArraysIndirectCommand;
                glDrawArraysIndirect(GlTopology, reinterpret_cast<const void*>(StaticCast<size_t>(Offset)));
                // Note that on GLES 3.1, baseInstance is present but reserved and must be zero
                DEV_CHECK_GL_ERROR("glDrawArraysIndirect() failed");
            }
#else
            LOG_ERROR_MESSAGE("Indirect rendering is not supported");
#endif
        }
    }
    else
    {
        PrepareForIndirectDrawCount(Attribs.pCounterBuffer);

#if GL_VERSION_4_6
        glMultiDrawArraysIndirectCount(GlTopology,
                                       reinterpret_cast<const void*>(StaticCast<size_t>(Attribs.DrawArgsOffset)),
                                       StaticCast<GLintptr>(Attribs.CounterOffset),
                                       Attribs.DrawCount,
                                       Attribs.DrawArgsStride);
        DEV_CHECK_GL_ERROR("glMultiDrawArraysIndirectCount() failed");

        constexpr bool ResetVAO = false; // GL_PARAMETER_BUFFER does not affect VAO
        m_ContextState.BindBuffer(GL_PARAMETER_BUFFER, GLObjectWrappers::GLBufferObj::Null(), ResetVAO);
#else
        LOG_ERROR_MESSAGE("Multi indirect count rendering is not supported");
#endif
    }

    constexpr bool ResetVAO = false; // GL_DRAW_INDIRECT_BUFFER does not affect VAO
    m_ContextState.BindBuffer(GL_DRAW_INDIRECT_BUFFER, GLObjectWrappers::GLBufferObj::Null(), ResetVAO);

    PostDraw();
}